

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.c
# Opt level: O0

int fits_clean_url(char *inURL,char *outURL,int *status)

{
  int iVar1;
  grp_stack *pgVar2;
  char *pcVar3;
  grp_stack_data __s;
  size_t sVar4;
  size_t sVar5;
  int *in_RDX;
  char *in_RSI;
  char *in_RDI;
  size_t string_size;
  char *saveptr;
  char *tmp;
  grp_stack *mystack;
  grp_stack_data in_stack_ffffffffffffffa8;
  grp_stack *in_stack_ffffffffffffffb0;
  char *local_30;
  char *local_10;
  
  if (*in_RDX != 0) {
    return *in_RDX;
  }
  pgVar2 = new_grp_stack();
  *in_RSI = '\0';
  pcVar3 = strstr(in_RDI,"://");
  local_10 = in_RDI;
  if (pcVar3 != (char *)0x0) {
    local_10 = strchr(pcVar3 + 3,0x2f);
    if (local_10 == (char *)0x0) {
      strcpy(in_RSI,in_RDI);
      goto LAB_001cda9a;
    }
    strncpy(in_RSI,in_RDI,(long)local_10 - (long)in_RDI);
    in_RSI[(long)local_10 - (long)in_RDI] = '\0';
  }
  if (*local_10 == '/') {
    strcat(in_RSI,"/");
  }
  local_30 = strtok(local_10,"/");
  while (local_30 != (char *)0x0) {
    iVar1 = strcmp(local_30,"..");
    if (iVar1 == 0) {
      if (pgVar2->stack_size == 0) {
        if (*local_10 != '/') {
          push_grp_stack(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
        }
      }
      else {
        pop_grp_stack(in_stack_ffffffffffffffb0);
      }
    }
    else {
      iVar1 = strcmp(local_30,".");
      if (iVar1 != 0) {
        push_grp_stack(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      }
    }
    local_30 = strtok((char *)0x0,"/");
  }
  while (pgVar2->stack_size != 0) {
    __s = shift_grp_stack(in_stack_ffffffffffffffb0);
    sVar4 = strlen(in_RSI);
    sVar5 = strlen(__s);
    if (0x400 < sVar4 + sVar5 + 1) {
      *in_RSI = '\0';
      ffpmsg((char *)0x1cda2f);
      *in_RDX = 0x7d;
      delete_grp_stack((grp_stack **)0x1cda44);
      return *in_RDX;
    }
    strcat(in_RSI,__s);
    strcat(in_RSI,"/");
  }
  sVar4 = strlen(in_RSI);
  in_RSI[sVar4 - 1] = '\0';
LAB_001cda9a:
  delete_grp_stack((grp_stack **)0x1cdaa4);
  return *in_RDX;
}

Assistant:

int fits_clean_url(char *inURL,  /* I input URL string                      */
		   char *outURL, /* O output URL string                     */
		   int  *status)
/*
  clean the URL by eliminating any ".." or "." specifiers in the inURL
  string, and write the output to the outURL string.

  Note that this function must have a valid Unix-style URL as input; platform
  dependent path strings are not allowed.
 */
{
  grp_stack* mystack; /* stack to hold pieces of URL */
  char* tmp;
  char *saveptr;

  if(*status) return *status;

  mystack = new_grp_stack();
  *outURL = 0;

  do {
    /* handle URL scheme and domain if they exist */
    tmp = strstr(inURL, "://");
    if(tmp) {
      /* there is a URL scheme, so look for the end of the domain too */
      tmp = strchr(tmp + 3, '/');
      if(tmp) {
        /* tmp is now the end of the domain, so
         * copy URL scheme and domain as is, and terminate by hand */
        size_t string_size = (size_t) (tmp - inURL);
        strncpy(outURL, inURL, string_size);
        outURL[string_size] = 0;

        /* now advance the input pointer to just after the domain and go on */
        inURL = tmp;
      } else {
        /* '/' was not found, which means there are no path-like
         * portions, so copy whole inURL to outURL and we're done */
        strcpy(outURL, inURL);
        continue; /* while(0) */
      }
    }

    /* explicitly copy a leading / (absolute path) */
    if('/' == *inURL) strcat(outURL, "/");

    /* now clean the remainder of the inURL. push URL segments onto
     * stack, dealing with .. and . as we go */
    tmp = ffstrtok(inURL, "/",&saveptr); /* finds first / */
    while(tmp) {
      if(!strcmp(tmp, "..")) {
        /* discard previous URL segment, if there was one. if not,
         * add the .. to the stack if this is *not* an absolute path
         * (for absolute paths, leading .. has no effect, so skip it) */
        if(0 < mystack->stack_size) pop_grp_stack(mystack);
        else if('/' != *inURL) push_grp_stack(mystack, tmp);
      } else {
        /* always just skip ., but otherwise add segment to stack */
        if(strcmp(tmp, ".")) push_grp_stack(mystack, tmp);
      }
      tmp = ffstrtok(NULL, "/",&saveptr); /* get the next segment */
    }

    /* stack now has pieces of cleaned URL, so just catenate them
     * onto output string until stack is empty */
    while(0 < mystack->stack_size) {
      tmp = shift_grp_stack(mystack);
      if (strlen(outURL) + strlen(tmp) + 1 > FLEN_FILENAME-1)
      {
         outURL[0]=0;
         ffpmsg("outURL is too long (fits_clean_url)");
         *status = URL_PARSE_ERROR;
         delete_grp_stack(&mystack);
         return *status;         
      }
      strcat(outURL, tmp);
      strcat(outURL, "/");
    }
    outURL[strlen(outURL) - 1] = 0; /* blank out trailing / */
  } while(0);
  delete_grp_stack(&mystack);
  return *status;
}